

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  char *__s;
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  size_t sVar7;
  int *piVar8;
  code *params_1;
  int extraout_EDX;
  undefined4 in_register_00000014;
  anon_class_24_3_9ec25511 *func_00;
  anon_class_24_3_9ec25511 *extraout_RDX;
  char *pcVar9;
  ArrayPtr<kj::StringPtr> params;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  StringPtr params_stack [8];
  undefined8 *local_448;
  ulong local_440;
  uint local_42c;
  undefined8 *local_428;
  MainFunc *local_420;
  undefined8 *local_418;
  ulong local_410;
  char **local_408;
  MainFunc *local_400;
  char ***local_3f8;
  undefined8 **local_3f0;
  Maybe<kj::Exception> local_3e8;
  undefined1 local_250 [8];
  undefined1 local_248 [24];
  char *local_230;
  int iStack_228;
  Type TStack_224;
  char *local_220;
  size_t sStack_218;
  ArrayDisposer *local_210;
  Disposer *pDStack_208;
  Context *local_200;
  char *pcStack_1f8;
  size_t local_1f0;
  ArrayDisposer *local_1e8;
  undefined1 local_1e0 [264];
  Detail *local_d8;
  RemoveConst<kj::Exception::Detail> *pRStack_d0;
  Detail *local_c8;
  ArrayDisposer *pAStack_c0;
  undefined8 local_b8 [17];
  
  func_00 = (anon_class_24_3_9ec25511 *)CONCAT44(in_register_00000014,argc);
  local_250 = (undefined1  [8])&local_42c;
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_248._8_8_ = " > ";
  local_248._16_8_ = (ArrayDisposer *)0x4;
  local_230 = (char *)CONCAT71(local_230._1_7_,0 < argc);
  local_42c = argc;
  local_408 = argv;
  if (argc < 1) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
              ((Fault *)&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0xd4,FAILED,"argc > 0","_kjCondition,",(DebugComparison<int_&,_int> *)local_250);
    _::Debug::Fault::fatal((Fault *)&local_3e8);
  }
  local_410 = (ulong)(argc - 1);
  lVar4 = 0;
  pcVar9 = "";
  do {
    *(char **)((long)local_b8 + lVar4) = "";
    *(undefined8 *)((long)local_b8 + lVar4 + 8) = 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x80);
  if ((uint)argc < 10) {
    puVar5 = local_b8;
    local_448 = (undefined8 *)0x0;
    local_440 = 0;
    local_428 = (undefined8 *)0x0;
    params_1 = (code *)argv;
  }
  else {
    params_1 = _::HeapArrayDisposer::Allocate_<kj::StringPtr>::construct;
    puVar5 = (undefined8 *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,local_410,local_410,
                        _::HeapArrayDisposer::Allocate_<kj::StringPtr>::construct,
                        ArrayDisposer::Dispose_<kj::StringPtr>::destruct);
    local_428 = &_::HeapArrayDisposer::instance;
    func_00 = (anon_class_24_3_9ec25511 *)(ulong)local_42c;
    local_448 = puVar5;
    local_440 = local_410;
  }
  local_420 = func;
  local_418 = puVar5;
  if (1 < (int)func_00) {
    uVar6 = (ulong)func_00 & 0xffffffff;
    lVar4 = 0;
    do {
      __s = *(char **)((long)argv + lVar4 + 8);
      sVar7 = strlen(__s);
      *(char **)((long)puVar5 + lVar4 * 2) = __s;
      *(size_t *)((long)puVar5 + lVar4 * 2 + 8) = sVar7 + 1;
      lVar4 = lVar4 + 8;
      func_00 = extraout_RDX;
    } while (uVar6 * 8 + -8 != lVar4);
  }
  local_400 = local_420;
  local_3f8 = &local_408;
  local_3f0 = &local_418;
  runCatchingExceptions<kj::runMainAndExit(kj::ProcessContext&,kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>&&,int,char**)::__0>
            (&local_3e8,(kj *)&local_400,func_00);
  uVar1 = local_3e8.ptr.field_1.value.context.ptr.ptr;
  local_250[0] = local_3e8.ptr.isSet;
  if (local_3e8.ptr.isSet == false) {
    bVar2 = 0;
  }
  else {
    local_248._0_8_ = local_3e8.ptr.field_1.value.ownFile.content.ptr;
    local_248._8_8_ = local_3e8.ptr.field_1.value.ownFile.content.size_;
    local_248._16_8_ = local_3e8.ptr.field_1.value.ownFile.content.disposer;
    local_3e8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_3e8.ptr.field_1.value.ownFile.content.size_ = 0;
    local_230 = local_3e8.ptr.field_1.value.file;
    iStack_228 = local_3e8.ptr.field_1.value.line;
    TStack_224 = local_3e8.ptr.field_1.value.type;
    local_220 = local_3e8.ptr.field_1.value.description.content.ptr;
    sStack_218 = local_3e8.ptr.field_1.value.description.content.size_;
    local_3e8.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_3e8.ptr.field_1.value.description.content.size_ = 0;
    local_210 = local_3e8.ptr.field_1.value.description.content.disposer;
    pDStack_208 = local_3e8.ptr.field_1.value.context.ptr.disposer;
    local_3e8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_200 = (Context *)uVar1;
    pcStack_1f8 = local_3e8.ptr.field_1.value.remoteTrace.content.ptr;
    local_1f0 = local_3e8.ptr.field_1.value.remoteTrace.content.size_;
    local_1e8 = local_3e8.ptr.field_1.value.remoteTrace.content.disposer;
    local_3e8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_3e8.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_1e0,(void *)((long)&local_3e8.ptr.field_1 + 0x68),0x105);
    local_d8 = local_3e8.ptr.field_1.value.details.builder.ptr;
    pRStack_d0 = local_3e8.ptr.field_1.value.details.builder.pos;
    local_c8 = local_3e8.ptr.field_1.value.details.builder.endPtr;
    pAStack_c0 = local_3e8.ptr.field_1.value.details.builder.disposer;
    local_3e8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_3e8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_3e8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    Exception::~Exception(&local_3e8.ptr.field_1.value);
    str<char_const(&)[28],kj::Exception&>
              ((String *)&local_3e8,(kj *)"*** Uncaught exception ***\n",(char (*) [28])local_248,
               (Exception *)params_1);
    if (local_3e8.ptr.field_1.value.ownFile.content.ptr != (char *)0x0) {
      pcVar9 = (char *)CONCAT71(local_3e8.ptr._1_7_,local_3e8.ptr.isSet);
    }
    (*context->_vptr_ProcessContext[3])
              (context,pcVar9,
               local_3e8.ptr.field_1.value.ownFile.content.ptr +
               (local_3e8.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
    String::~String((String *)&local_3e8);
    bVar2 = local_250[0];
  }
  if ((bVar2 & 1) != 0) {
    Exception::~Exception((Exception *)local_248);
  }
  iVar3 = (*context->_vptr_ProcessContext[1])(context);
  String::~String((String *)&local_3e8);
  if (local_250[0] == '\x01') {
    Exception::~Exception((Exception *)local_248);
  }
  if (local_448 != (undefined8 *)0x0) {
    (**(code **)*local_428)(local_428,local_448,0x10,local_440,local_440,0);
  }
  if (extraout_EDX == 1) {
    piVar8 = (int *)__cxa_begin_catch();
    iVar3 = *piVar8;
    __cxa_end_catch();
    return iVar3;
  }
  _Unwind_Resume(iVar3);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

  try {
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_SOME(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", exception));
    }
    context.exit();
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}